

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O1

int math_randomseed(lua_State *L)

{
  int iVar1;
  unsigned_long *state;
  lua_State *n2;
  lua_Unsigned n1;
  lua_Number lVar2;
  
  state = (unsigned_long *)lua_touserdata(L,-0xf4629);
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    n1 = time((time_t *)0x0);
    n2 = L;
  }
  else {
    lVar2 = luaL_checknumber(L,1);
    n1 = (lua_Unsigned)lVar2;
    n2 = (lua_State *)luaL_optinteger(L,2,0);
  }
  setseed(L,state,n1,(lua_Unsigned)n2);
  return 2;
}

Assistant:

static int math_randomseed (lua_State *L) {
  RanState *state = (RanState *)lua_touserdata(L, lua_upvalueindex(1));
  if (lua_isnone(L, 1)) {
    randseed(L, state);
  }
  else {
    lua_Integer n1 = (lua_Integer)luaL_checknumber(L, 1);
    lua_Integer n2 = luaL_optinteger(L, 2, 0);
    setseed(L, state->s, n1, n2);
  }
  return 2;  /* return seeds */
}